

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ProblemDecTiger.cpp
# Opt level: O1

void __thiscall ProblemDecTiger::ProblemDecTiger(ProblemDecTiger *this)

{
  MADPComponentDiscreteStates *this_00;
  MADPComponentDiscreteActions *this_01;
  MADPComponentDiscreteObservations *this_02;
  string local_90;
  string local_70;
  string local_50;
  
  *(undefined8 *)&this->field_0x240 = 0x5b0d60;
  *(undefined8 *)&this->field_0x248 = 0x5b0fb8;
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"The Dec-Tiger Problem","");
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_70,
             "A toy problem, 2-agent Dec-POMDP. 2 agents have to select 1 out of 2 doors, behind one is a tiger, behind the other treasure."
             ,"");
  local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"DecTiger","");
  DecPOMDPDiscrete::DecPOMDPDiscrete
            (&this->super_DecPOMDPDiscrete,&PTR_construction_vtable_96__005afaa8,&local_50,&local_70
             ,&local_90);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  *(undefined8 *)
   &(this->super_DecPOMDPDiscrete).super_MultiAgentDecisionProcessDiscrete.
    super_MultiAgentDecisionProcess = 0x5af2d0;
  *(undefined8 *)&this->field_0x240 = 0x5af6d0;
  *(undefined8 *)&this->field_0x248 = 0x5af928;
  *(undefined8 *)&(this->super_DecPOMDPDiscrete).super_MultiAgentDecisionProcessDiscrete.field_0x200
       = 0x5af548;
  *(undefined8 *)&(this->super_DecPOMDPDiscrete).field_0x220 = 2;
  *(undefined8 *)&(this->super_DecPOMDPDiscrete).field_0x228 = 2;
  this->NUMBER_OF_OBSERVATIONS = 2;
  this->NUMBER_OF_ACTIONS = 3;
  MultiAgentDecisionProcess::SetNrAgents((MultiAgentDecisionProcess *)this,2);
  this_00 = &(this->super_DecPOMDPDiscrete).super_MultiAgentDecisionProcessDiscrete._m_S;
  MADPComponentDiscreteStates::SetNrStates
            (this_00,*(size_t *)&(this->super_DecPOMDPDiscrete).field_0x220);
  MADPComponentDiscreteStates::SetUniformISD(this_00);
  (**(code **)(*(long *)&(this->super_DecPOMDPDiscrete).super_MultiAgentDecisionProcessDiscrete.
                         field_0x200 + 0x68))(0x3ff0000000000000);
  ConstructActions(this);
  this_01 = &(this->super_DecPOMDPDiscrete).super_MultiAgentDecisionProcessDiscrete._m_A;
  MADPComponentDiscreteActions::ConstructJointActions(this_01);
  MADPComponentDiscreteActions::SetInitialized(this_01,true);
  ConstructObservations(this);
  this_02 = &(this->super_DecPOMDPDiscrete).super_MultiAgentDecisionProcessDiscrete._m_O;
  MADPComponentDiscreteObservations::ConstructJointObservations(this_02);
  MADPComponentDiscreteObservations::SetInitialized(this_02,true);
  MultiAgentDecisionProcessDiscrete::CreateNewTransitionModel
            ((MultiAgentDecisionProcessDiscrete *)this);
  FillTransitionModel(this);
  MultiAgentDecisionProcessDiscrete::CreateNewObservationModel
            ((MultiAgentDecisionProcessDiscrete *)this);
  FillObservationModel(this);
  MultiAgentDecisionProcessDiscrete::SetInitialized((MultiAgentDecisionProcessDiscrete *)this,true);
  (**(code **)(*(long *)&(this->super_DecPOMDPDiscrete).super_MultiAgentDecisionProcessDiscrete.
                         super_MultiAgentDecisionProcess + 0x178))(this);
  FillRewardModel(this);
  DecPOMDPDiscrete::SetInitialized(&this->super_DecPOMDPDiscrete,true);
  return;
}

Assistant:

ProblemDecTiger::ProblemDecTiger() :
    DecPOMDPDiscrete(
        "The Dec-Tiger Problem",
        "A toy problem, 2-agent Dec-POMDP. 2 agents have to select 1 out of 2 doors, behind one is a tiger, behind the other treasure.",
        "DecTiger"),
    NUMBER_OF_STATES(2),
    NUMBER_OF_AGENTS(2),
    NUMBER_OF_OBSERVATIONS(2),
    NUMBER_OF_ACTIONS(3)
{
    SetNrAgents(NUMBER_OF_AGENTS);
    SetNrStates(NUMBER_OF_STATES);

    SetUniformISD();
    SetDiscount(1);
    
    // add actions:
    ConstructActions();
    if(DEBUG_CJA) cout << "\n>>>Creating joint actions and set...\n"<<endl;
    // add joint actions
    size_t testNRJA = ConstructJointActions();
    if(DEBUG_CA) cout << "testNRJA="<<testNRJA<<endl;    

    SetActionsInitialized(true);

    // add observations:
    ConstructObservations();
    size_t testNRJO = ConstructJointObservations();
    if(DEBUG_CO) cout << "testNRJO="<<testNRJO<<endl;

    SetObservationsInitialized(true);

    // add the transition model
    if(DEBUG_PDT) cout << "\n>>>Adding Transition model...\n"<<endl;
    CreateNewTransitionModel();
    FillTransitionModel();    

    // add observation model
    if(DEBUG_PDT) cout << "\n>>>Adding Observation model...\n"<<endl;
    CreateNewObservationModel();
    FillObservationModel();
    MultiAgentDecisionProcessDiscrete::SetInitialized(true);

    // add rewards
    CreateNewRewardModel();
    FillRewardModel();
    if(DEBUG_PDT)     cout << "Model created..."<<endl; 
    DecPOMDPDiscrete::SetInitialized(true);
}